

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-typed-test.cc
# Opt level: O3

char * __thiscall
testing::internal::TypedTestCasePState::VerifyRegisteredTestNames
          (TypedTestCasePState *this,char *file,int line,char *registered_tests)

{
  byte *pbVar1;
  size_t sVar2;
  undefined1 auVar3 [8];
  bool bVar4;
  int iVar5;
  char *pcVar6;
  char *__dest;
  const_iterator cVar7;
  _Rb_tree_node_base *p_Var8;
  size_t sVar9;
  _Rb_tree_node_base *p_Var10;
  undefined8 extraout_RAX;
  char *pcVar11;
  ostream *poVar12;
  undefined1 local_b0 [8];
  set<testing::internal::String,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
  tests;
  String local_70;
  _Rb_tree_node_base *local_60;
  TypedTestCasePState *local_58;
  uint local_4c;
  undefined1 local_48 [8];
  String name;
  
  *this = (TypedTestCasePState)0x1;
  pcVar11 = registered_tests + -1;
  local_58 = this;
  local_4c = line;
  do {
    pbVar1 = (byte *)(pcVar11 + 1);
    pcVar11 = pcVar11 + 1;
    iVar5 = isspace((uint)*pbVar1);
  } while (iVar5 != 0);
  Message::Message((Message *)&name.length_);
  tests._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&tests;
  tests._M_t._M_impl._0_4_ = 0;
  tests._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tests._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  tests._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_60 = (_Rb_tree_node_base *)(local_58 + 0x10);
  tests._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       tests._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  tests._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pcVar11;
  do {
    pcVar6 = strchr(pcVar11,0x2c);
    if (pcVar6 == (char *)0x0) {
      String::String((String *)local_48,pcVar11);
    }
    else {
      pcVar6 = pcVar6 + -(long)pcVar11;
      __dest = (char *)operator_new__((ulong)(pcVar6 + 1));
      memcpy(__dest,pcVar11,(size_t)pcVar6);
      __dest[(long)pcVar6] = '\0';
      local_48 = (undefined1  [8])__dest;
      name.c_str_ = pcVar6;
    }
    cVar7 = std::
            _Rb_tree<testing::internal::String,_testing::internal::String,_std::_Identity<testing::internal::String>,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
            ::find((_Rb_tree<testing::internal::String,_testing::internal::String,_std::_Identity<testing::internal::String>,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
                    *)local_b0,(String *)local_48);
    p_Var10 = local_60;
    if (cVar7._M_node == (_Base_ptr)&tests) {
      for (p_Var8 = *(_Rb_tree_node_base **)(local_58 + 0x20); p_Var8 != p_Var10;
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
        bVar4 = String::operator==((String *)local_48,*(char **)(p_Var8 + 1));
        if (bVar4) {
          std::
          _Rb_tree<testing::internal::String,testing::internal::String,std::_Identity<testing::internal::String>,std::less<testing::internal::String>,std::allocator<testing::internal::String>>
          ::_M_insert_unique<testing::internal::String_const&>
                    ((_Rb_tree<testing::internal::String,testing::internal::String,std::_Identity<testing::internal::String>,std::less<testing::internal::String>,std::allocator<testing::internal::String>>
                      *)local_b0,(String *)local_48);
          goto LAB_0012bbca;
        }
      }
      poVar12 = (ostream *)(name.length_ + 0x10);
      if (name.length_ == 0) {
        poVar12 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"No test named ",0xe);
      auVar3 = local_48;
      poVar12 = (ostream *)(name.length_ + 0x10);
      if (name.length_ == 0) {
        poVar12 = (ostream *)0x0;
      }
      if (local_48 == (undefined1  [8])0x0) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"(null)",6);
      }
      else if (name.c_str_ != (char *)0x0) {
        pcVar6 = (char *)0x0;
        do {
          if (*(char *)((long)auVar3 + (long)pcVar6) == '\0') {
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\\0",2);
          }
          else {
            local_70.c_str_._0_1_ = *(char *)((long)auVar3 + (long)pcVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)&local_70,1);
          }
          pcVar6 = pcVar6 + 1;
        } while (pcVar6 != name.c_str_);
      }
      poVar12 = (ostream *)(name.length_ + 0x10);
      if (name.length_ == 0) {
        poVar12 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12," can be found in this test case.\n",0x21);
    }
    else {
      poVar12 = (ostream *)(name.length_ + 0x10);
      if (name.length_ == 0) {
        poVar12 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"Test ",5);
      auVar3 = local_48;
      poVar12 = (ostream *)(name.length_ + 0x10);
      if (name.length_ == 0) {
        poVar12 = (ostream *)0x0;
      }
      if (local_48 == (undefined1  [8])0x0) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"(null)",6);
      }
      else if (name.c_str_ != (char *)0x0) {
        pcVar6 = (char *)0x0;
        do {
          if (*(char *)((long)auVar3 + (long)pcVar6) == '\0') {
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\\0",2);
          }
          else {
            local_70.c_str_._0_1_ = *(char *)((long)auVar3 + (long)pcVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)&local_70,1);
          }
          pcVar6 = pcVar6 + 1;
        } while (pcVar6 != name.c_str_);
      }
      poVar12 = (ostream *)(name.length_ + 0x10);
      if (name.length_ == 0) {
        poVar12 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12," is listed more than once.\n",0x1b);
    }
LAB_0012bbca:
    if (local_48 != (undefined1  [8])0x0) {
      operator_delete__((void *)local_48);
    }
    pcVar11 = strchr(pcVar11,0x2c);
    if (pcVar11 == (char *)0x0) {
      p_Var10 = *(_Rb_tree_node_base **)(local_58 + 0x20);
      if (p_Var10 != local_60) {
        do {
          String::String((String *)local_48,*(char **)(p_Var10 + 1));
          cVar7 = std::
                  _Rb_tree<testing::internal::String,_testing::internal::String,_std::_Identity<testing::internal::String>,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
                  ::find((_Rb_tree<testing::internal::String,_testing::internal::String,_std::_Identity<testing::internal::String>,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
                          *)local_b0,(String *)local_48);
          if (local_48 != (undefined1  [8])0x0) {
            operator_delete__((void *)local_48);
          }
          if (cVar7._M_node == (_Base_ptr)&tests) {
            poVar12 = (ostream *)(name.length_ + 0x10);
            if (name.length_ == 0) {
              poVar12 = (ostream *)0x0;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,"You forgot to list test ",0x18);
            pcVar11 = *(char **)(p_Var10 + 1);
            if (pcVar11 == (char *)0x0) {
              poVar12 = (ostream *)(name.length_ + 0x10);
              sVar9 = 6;
              pcVar11 = "(null)";
            }
            else {
              poVar12 = (ostream *)name.length_;
              if (name.length_ != 0) {
                poVar12 = (ostream *)(name.length_ + 0x10);
              }
              sVar9 = strlen(pcVar11);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar11,sVar9);
            poVar12 = (ostream *)(name.length_ + 0x10);
            if (name.length_ == 0) {
              poVar12 = (ostream *)0x0;
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,".\n",2);
          }
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
        } while (p_Var10 != local_60);
      }
      StringStreamToString((internal *)local_48,(stringstream *)name.length_);
      bVar4 = String::operator==((String *)local_48,"");
      sVar2 = tests._M_t._M_impl.super__Rb_tree_header._M_node_count;
      if (bVar4) {
        if (local_48 != (undefined1  [8])0x0) {
          operator_delete__((void *)local_48);
        }
        std::
        _Rb_tree<testing::internal::String,_testing::internal::String,_std::_Identity<testing::internal::String>,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
        ::~_Rb_tree((_Rb_tree<testing::internal::String,_testing::internal::String,_std::_Identity<testing::internal::String>,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
                     *)local_b0);
        if (name.length_ != 0) {
          (**(code **)(*(long *)name.length_ + 8))();
        }
        return (char *)sVar2;
      }
      pcVar11 = "unknown file";
      if (file != (char *)0x0) {
        pcVar11 = file;
      }
      if ((int)local_4c < 0) {
        String::Format(&local_70,"%s:",pcVar11);
      }
      else {
        String::Format(&local_70,"%s:%d:",pcVar11,(ulong)local_4c);
      }
      VerifyRegisteredTestNames();
      if (local_48 != (undefined1  [8])0x0) {
        operator_delete__((void *)local_48);
      }
      std::
      _Rb_tree<testing::internal::String,_testing::internal::String,_std::_Identity<testing::internal::String>,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
      ::~_Rb_tree((_Rb_tree<testing::internal::String,_testing::internal::String,_std::_Identity<testing::internal::String>,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
                   *)local_b0);
      if (name.length_ != 0) {
        (**(code **)(*(long *)name.length_ + 8))();
      }
      _Unwind_Resume(extraout_RAX);
    }
    do {
      pbVar1 = (byte *)(pcVar11 + 1);
      pcVar11 = pcVar11 + 1;
      iVar5 = isspace((uint)*pbVar1);
    } while (iVar5 != 0);
  } while( true );
}

Assistant:

const char* TypedTestCasePState::VerifyRegisteredTestNames(
    const char* file, int line, const char* registered_tests) {
  typedef ::std::set<const char*>::const_iterator DefinedTestIter;
  registered_ = true;

  // Skip initial whitespace in registered_tests since some
  // preprocessors prefix stringizied literals with whitespace.
  registered_tests = SkipSpaces(registered_tests);

  Message errors;
  ::std::set<String> tests;
  for (const char* names = registered_tests; names != NULL;
       names = SkipComma(names)) {
    const String name = GetPrefixUntilComma(names);
    if (tests.count(name) != 0) {
      errors << "Test " << name << " is listed more than once.\n";
      continue;
    }

    bool found = false;
    for (DefinedTestIter it = defined_test_names_.begin();
         it != defined_test_names_.end();
         ++it) {
      if (name == *it) {
        found = true;
        break;
      }
    }

    if (found) {
      tests.insert(name);
    } else {
      errors << "No test named " << name
             << " can be found in this test case.\n";
    }
  }

  for (DefinedTestIter it = defined_test_names_.begin();
       it != defined_test_names_.end();
       ++it) {
    if (tests.count(*it) == 0) {
      errors << "You forgot to list test " << *it << ".\n";
    }
  }

  const String& errors_str = errors.GetString();
  if (errors_str != "") {
    fprintf(stderr, "%s %s", FormatFileLocation(file, line).c_str(),
            errors_str.c_str());
    fflush(stderr);
    posix::Abort();
  }

  return registered_tests;
}